

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvParticle_dns.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  UserData udata;
  N_Vector y;
  undefined8 *puVar3;
  N_Vector p_Var4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  FILE *YFID;
  char *pcVar8;
  int iVar9;
  double dVar10;
  SUNContext sunctx;
  sunrealtype t;
  sunrealtype ec;
  int local_90;
  undefined8 local_88;
  sunrealtype local_80;
  N_Vector local_78;
  sunrealtype local_70;
  long local_68;
  FILE *local_60;
  FILE *local_58;
  void *local_50;
  int local_44;
  long local_40;
  double local_38;
  
  local_80 = 0.0;
  local_70 = 0.0;
  local_88 = 0;
  uVar1 = SUNContext_Create(0);
  if ((int)uVar1 < 0) {
    pcVar8 = "SUNContext_Create";
    goto LAB_00102cf1;
  }
  udata = (UserData)malloc(0x38);
  if (udata == (UserData)0x0) {
    main_cold_6();
    return 1;
  }
  udata->alpha = 1.0;
  udata->orbits = 100;
  udata->torbit = 6.283185307179586;
  udata->rtol = 0.0001;
  udata->atol = 1e-09;
  udata->proj = 1;
  udata->projerr = 0;
  udata->tstop = 0;
  udata->nout = 0;
  if (1 < argc) {
    local_90 = 1;
    iVar9 = 1;
    do {
      pcVar8 = argv[iVar9];
      iVar2 = strcmp(pcVar8,"--alpha");
      if (iVar2 == 0) {
        dVar10 = atof(argv[(long)iVar9 + 1]);
        udata->alpha = dVar10;
        udata->torbit = 6.283185307179586 / dVar10;
        iVar9 = iVar9 + 2;
      }
      else {
        iVar2 = strcmp(pcVar8,"--orbits");
        if (iVar2 == 0) {
          iVar2 = atoi(argv[(long)iVar9 + 1]);
          udata->orbits = iVar2;
          iVar9 = iVar9 + 2;
        }
        else {
          iVar2 = strcmp(pcVar8,"--rtol");
          if (iVar2 == 0) {
            dVar10 = atof(argv[(long)iVar9 + 1]);
            udata->rtol = dVar10;
            iVar9 = iVar9 + 2;
          }
          else {
            iVar2 = strcmp(pcVar8,"--atol");
            if (iVar2 == 0) {
              dVar10 = atof(argv[(long)iVar9 + 1]);
              udata->atol = dVar10;
              iVar9 = iVar9 + 2;
            }
            else {
              iVar2 = strcmp(pcVar8,"--proj");
              if (iVar2 == 0) {
                local_90 = atoi(argv[(long)iVar9 + 1]);
                udata->proj = local_90;
                iVar9 = iVar9 + 2;
              }
              else {
                iVar2 = strcmp(pcVar8,"--projerr");
                if (iVar2 == 0) {
                  iVar2 = atoi(argv[(long)iVar9 + 1]);
                  udata->projerr = iVar2;
                  iVar9 = iVar9 + 2;
                }
                else {
                  iVar2 = strcmp(pcVar8,"--nout");
                  if (iVar2 == 0) {
                    iVar2 = atoi(argv[(long)iVar9 + 1]);
                    udata->nout = iVar2;
                    iVar9 = iVar9 + 2;
                  }
                  else {
                    iVar2 = strcmp(pcVar8,"--tstop");
                    if (iVar2 != 0) {
                      main_cold_1();
                      return 1;
                    }
                    udata->tstop = 1;
                    iVar9 = iVar9 + 1;
                  }
                }
              }
            }
          }
        }
      }
    } while (iVar9 < argc);
    if (local_90 == 0) {
      udata->projerr = 0;
    }
  }
  y = (N_Vector)N_VNew_Serial(2,local_88);
  if (y == (N_Vector)0x0) {
    main_cold_5();
    return 1;
  }
  puVar3 = (undefined8 *)N_VGetArrayPointer(y);
  *puVar3 = 0x3ff0000000000000;
  puVar3[1] = 0;
  p_Var4 = (N_Vector)N_VClone(y);
  N_VConst(0,p_Var4);
  pvVar5 = (void *)CVodeCreate(2,local_88);
  local_50 = pvVar5;
  if (pvVar5 == (void *)0x0) {
    main_cold_4();
    return 1;
  }
  uVar1 = CVodeInit(0,pvVar5,f,y);
  if ((int)uVar1 < 0) {
    pcVar8 = "CVodeInit";
    goto LAB_00102cf1;
  }
  uVar1 = CVodeSetUserData(pvVar5,udata);
  if ((int)uVar1 < 0) {
    pcVar8 = "CVodeSetUserData";
    goto LAB_00102cf1;
  }
  uVar1 = CVodeSStolerances(SUB84(udata->rtol,0),pvVar5);
  if ((int)uVar1 < 0) {
    pcVar8 = "CVodeSStolerances";
    goto LAB_00102cf1;
  }
  lVar6 = SUNDenseMatrix(2,2,local_88);
  if (lVar6 == 0) {
    main_cold_3();
    return 1;
  }
  lVar7 = SUNLinSol_Dense(y,lVar6,local_88);
  if (lVar7 == 0) {
    main_cold_2();
    return 1;
  }
  uVar1 = CVodeSetLinearSolver(pvVar5,lVar7,lVar6);
  if ((int)uVar1 < 0) {
    pcVar8 = "CVodeSetLinearSolver";
    goto LAB_00102cf1;
  }
  uVar1 = CVodeSetJacFn(pvVar5,Jac);
  if ((int)uVar1 < 0) {
    pcVar8 = "CVodeSetJacFn";
    goto LAB_00102cf1;
  }
  if (udata->proj != 0) {
    uVar1 = CVodeSetProjFn(pvVar5,Proj);
    if ((int)uVar1 < 0) {
      pcVar8 = "CVodeSetProjFn";
      goto LAB_00102cf1;
    }
    uVar1 = CVodeSetProjErrEst(pvVar5,udata->projerr);
    if ((int)uVar1 < 0) {
      pcVar8 = "CVodeSetProjErrEst";
      goto LAB_00102cf1;
    }
  }
  uVar1 = CVodeSetMaxNumSteps(pvVar5,100000);
  if ((int)uVar1 < 0) {
    pcVar8 = "CVodeSetMaxNumSteps";
    goto LAB_00102cf1;
  }
  uVar1 = PrintUserData(udata);
  if ((int)uVar1 < 0) {
    pcVar8 = "PrintUserData";
    goto LAB_00102cf1;
  }
  local_58 = (FILE *)0x0;
  local_40 = lVar7;
  printf("\n     t            x              y");
  puts("             err x          err y       err constr");
  WriteOutput(0.0,y,p_Var4,0.0,0,(FILE *)0x0,(FILE *)0x0);
  local_60 = (FILE *)0x0;
  if (udata->nout < 1) {
LAB_00102974:
    dVar10 = (double)udata->orbits * udata->torbit;
    iVar2 = 1;
LAB_00102991:
    local_44 = iVar2 + -1;
    iVar9 = 0;
    local_78 = p_Var4;
    local_68 = lVar6;
    local_38 = dVar10;
    do {
      pvVar5 = local_50;
      if (((udata->tstop != 0) || (udata->nout == 0)) &&
         (uVar1 = CVodeSetStopTime(SUB84(dVar10,0),local_50), (int)uVar1 < 0)) {
        pcVar8 = "CVodeSetStopTime";
        goto LAB_00102cf1;
      }
      uVar1 = CVode(SUB84(dVar10,0),pvVar5,y,&local_80,1);
      p_Var4 = local_78;
      if ((int)uVar1 < 0) {
        fprintf(_stderr,"\nERROR: %s() returned = %d\n\n","CVode",(ulong)uVar1);
        lVar6 = local_68;
        p_Var4 = local_78;
        break;
      }
      if (0 < udata->nout) {
        uVar1 = ComputeError(local_80,y,local_78,&local_70,udata);
        WriteOutput(local_80,y,p_Var4,local_70,1,(FILE *)local_60,(FILE *)local_58);
      }
      if (iVar9 < local_44) {
        dVar10 = dVar10 + local_38;
      }
      else {
        dVar10 = (double)udata->orbits * udata->torbit;
      }
      iVar9 = iVar9 + 1;
      lVar6 = local_68;
      p_Var4 = local_78;
    } while (iVar2 != iVar9);
  }
  else {
    YFID = fopen("cvParticle_solution.txt","w");
    local_58 = fopen("cvParticle_error.txt","w");
    local_60 = YFID;
    WriteOutput(0.0,y,p_Var4,0.0,1,(FILE *)YFID,(FILE *)local_58);
    iVar9 = udata->nout;
    if (iVar9 < 1) goto LAB_00102974;
    iVar2 = udata->orbits * iVar9;
    if (0 < iVar2) {
      dVar10 = udata->torbit / (double)iVar9;
      goto LAB_00102991;
    }
    uVar1 = 0;
  }
  if (0 < udata->nout) {
    fclose(local_60);
    fclose(local_58);
  }
  ComputeError(local_80,y,p_Var4,&local_70,udata);
  if (-1 < (int)uVar1) {
    WriteOutput(local_80,y,p_Var4,local_70,0,(FILE *)0x0,(FILE *)0x0);
    PrintStats(local_50);
    free(udata);
    N_VDestroy(y);
    N_VDestroy(p_Var4);
    SUNMatDestroy(lVar6);
    SUNLinSolFree(local_40);
    CVodeFree(&local_50);
    SUNContext_Free(&local_88);
    return 0;
  }
  pcVar8 = "ComputeError";
LAB_00102cf1:
  fprintf(_stderr,"\nERROR: %s() returned = %d\n\n",pcVar8,(ulong)uVar1);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  int retval;               /* reusable return flag       */
  int out           = 0;    /* output counter             */
  int totalout      = 0;    /* output counter             */
  sunrealtype t     = ZERO; /* current integration time   */
  sunrealtype dtout = ZERO; /* output spacing             */
  sunrealtype tout  = ZERO; /* next output time           */
  sunrealtype ec    = ZERO; /* constraint error           */
  UserData udata    = NULL; /* user data structure        */

  SUNContext sunctx  = NULL; /* SUNDIALS context     */
  void* cvode_mem    = NULL; /* CVODE memory         */
  N_Vector y         = NULL; /* solution vector      */
  sunrealtype* ydata = NULL; /* solution vector data */
  N_Vector e         = NULL; /* error vector         */
  SUNMatrix A        = NULL; /* Jacobian matrix      */
  SUNLinearSolver LS = NULL; /* linear solver        */

  FILE* YFID = NULL; /* solution output file */
  FILE* EFID = NULL; /* error output file    */

  /* Create the SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Allocate and initialize user data structure */
  udata = (UserData)malloc(sizeof *udata);
  if (check_retval((void*)udata, "malloc", 0)) { return (1); }

  retval = InitUserData(&argc, &argv, udata);
  if (check_retval(&retval, "InitUserData", 1)) { return (1); }

  /* Create serial vector to store the solution */
  y = N_VNew_Serial(2, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }

  /* Set initial contion */
  ydata    = N_VGetArrayPointer(y);
  ydata[0] = ONE;
  ydata[1] = ZERO;

  /* Create serial vector to store the solution error */
  e = N_VClone(y);
  if (check_retval((void*)y, "N_VClone", 0)) { return (1); }

  /* Set initial error */
  N_VConst(ZERO, e);

  /* Create CVODE memory */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Initialize CVODE */
  retval = CVodeInit(cvode_mem, f, t, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Attach user-defined data structure to CVODE */
  retval = CVodeSetUserData(cvode_mem, udata);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Set integration tolerances */
  retval = CVodeSStolerances(cvode_mem, udata->rtol, udata->atol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(2, 2, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(y, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver to CVODE */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /* Set a user-supplied Jacobian function */
  retval = CVodeSetJacFn(cvode_mem, Jac);
  if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }

  /* Set a user-supplied projection function */
  if (udata->proj)
  {
    retval = CVodeSetProjFn(cvode_mem, Proj);
    if (check_retval(&retval, "CVodeSetProjFn", 1)) { return (1); }

    retval = CVodeSetProjErrEst(cvode_mem, udata->projerr);
    if (check_retval(&retval, "CVodeSetProjErrEst", 1)) { return (1); }
  }

  /* Set max steps between outputs */
  retval = CVodeSetMaxNumSteps(cvode_mem, 100000);
  if (check_retval(&retval, "CVodeSetMaxNumSteps", 1)) { return (1); }

  /* Output problem setup */
  retval = PrintUserData(udata);
  if (check_retval(&retval, "PrintUserData", 1)) { return (1); }

  /* Output initial condition */
  printf("\n     t            x              y");
  printf("             err x          err y       err constr\n");
  WriteOutput(t, y, e, ec, 0, NULL, NULL);

  if (udata->nout > 0)
  {
    YFID = fopen("cvParticle_solution.txt", "w");
    EFID = fopen("cvParticle_error.txt", "w");
    WriteOutput(t, y, e, ec, 1, YFID, EFID);
  }

  /* Integrate in time and periodically output the solution and error */
  if (udata->nout > 0)
  {
    totalout = udata->orbits * udata->nout;
    dtout    = udata->torbit / udata->nout;
  }
  else
  {
    totalout = 1;
    dtout    = udata->torbit * udata->orbits;
  }
  tout = dtout;

  for (out = 0; out < totalout; out++)
  {
    /* Stop at output time (do not interpolate output) */
    if (udata->tstop || udata->nout == 0)
    {
      retval = CVodeSetStopTime(cvode_mem, tout);
      if (check_retval(&retval, "CVodeSetStopTime", 1)) { return (1); }
    }

    /* Advance in time */
    retval = CVode(cvode_mem, tout, y, &t, CV_NORMAL);
    if (check_retval(&retval, "CVode", 1)) { break; }

    /* Output solution and error */
    if (udata->nout > 0)
    {
      retval = ComputeError(t, y, e, &ec, udata);
      if (check_retval(&retval, "ComputeError", 1)) { break; }

      WriteOutput(t, y, e, ec, 1, YFID, EFID);
      if (check_retval(&retval, "WriteOutput", 1)) { break; }
    }

    /* Update output time */
    if (out < totalout - 1) { tout += dtout; }
    else { tout = udata->torbit * udata->orbits; }
  }

  /* Close output files */
  if (udata->nout > 0)
  {
    fclose(YFID);
    fclose(EFID);
  }

  /* Output final solution and error to screen */
  ComputeError(t, y, e, &ec, udata);
  if (check_retval(&retval, "ComputeError", 1)) { return (1); }

  WriteOutput(t, y, e, ec, 0, NULL, NULL);
  if (check_retval(&retval, "WriteOutput", 1)) { return (1); }

  /* Print some final statistics */
  PrintStats(cvode_mem);

  /* Free memory */
  free(udata);
  N_VDestroy(y);
  N_VDestroy(e);
  SUNMatDestroy(A);
  SUNLinSolFree(LS);
  CVodeFree(&cvode_mem);
  SUNContext_Free(&sunctx);

  return (0);
}